

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salesman.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
sort_tuples_and_give_result
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *vec)

{
  value_type *__x;
  value_type *pvVar1;
  ulong uVar2;
  value_type *pvVar3;
  int i;
  ulong uVar4;
  long lVar5;
  int i_1;
  bool bVar6;
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> sorted_vec;
  
  sorted_vec.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_vec.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sorted_vec.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar4 = 0;
  do {
    pvVar3 = (vec->super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(vec->
                  super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3;
    if (uVar2 <= uVar4) {
      lVar5 = 4;
      for (uVar4 = 0;
          uVar4 < (ulong)((long)sorted_vec.
                                super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)sorted_vec.
                                super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1)
      {
        std::vector<int,_std::allocator<int>_>::push_back
                  (__return_storage_ptr__,
                   (value_type_conflict1 *)
                   ((long)&((sorted_vec.
                             super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Tuple_impl<0UL,_int,_int>).super__Tuple_impl<1UL,_int>.
                           super__Head_base<1UL,_int,_false>._M_head_impl + lVar5));
        lVar5 = lVar5 + 8;
      }
      std::_Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::~_Vector_base
                (&sorted_vec.
                  super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>);
      return __return_storage_ptr__;
    }
    if (uVar4 == 0) {
      std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::push_back
                (&sorted_vec,pvVar3);
      pvVar3 = (vec->
               super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(vec->
                    super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3;
    }
    pvVar3 = pvVar3 + -1;
    do {
      bVar6 = uVar2 == 0;
      uVar2 = uVar2 - 1;
      if (bVar6) goto LAB_00102ad2;
      __x = pvVar3 + 1;
      pvVar1 = pvVar3 + 1;
      pvVar3 = __x;
    } while (sorted_vec.
             super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar4].super__Tuple_impl<0UL,_int,_int>.
             super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl !=
             (pvVar1->super__Tuple_impl<0UL,_int,_int>).super__Head_base<0UL,_int,_false>.
             _M_head_impl);
    std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::push_back
              (&sorted_vec,__x);
LAB_00102ad2:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::vector<int> sort_tuples_and_give_result(std::vector<std::tuple<int,int>> &vec){
    std::vector<std::tuple<int,int>> sorted_vec;
    std::tuple<int,int> buff;
    std::vector<int> vec_results;


    for(int i=0; i<vec.size(); i++){
        if(i==0){
            sorted_vec.push_back(vec[i]);
        }
        buff = sorted_vec[i];
        for(int j=0; j<vec.size();j++){
            if(std::get<1>(buff)==std::get<0>(vec[j])){
                sorted_vec.push_back(vec[j]);
                break;

            }
        }
    }

    for(int i=0; i<sorted_vec.size(); i++){
        vec_results.push_back(std::get<0>(sorted_vec[i]));
    }
    return vec_results;
}